

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

void * __thiscall
Centaurus::SkipRoutineEM64T<wchar_t>::operator()(SkipRoutineEM64T<wchar_t> *this,void *input)

{
  code *in_RAX;
  void *pvVar1;
  _func_void_ptr_void_ptr *func;
  code *local_18;
  
  local_18 = in_RAX;
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&this->m_runtime,&local_18,&this->m_code);
  pvVar1 = (void *)(*local_18)(input);
  return pvVar1;
}

Assistant:

virtual ~CharClass()
    {
    }